

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  int iVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  __m128i *ptr;
  __m128i *palVar12;
  __m128i *ptr_00;
  int32_t *ptr_01;
  int iVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  __m128i *palVar20;
  __m128i *palVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar32;
  uint uVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  uint uVar37;
  uint uVar39;
  uint uVar40;
  undefined1 auVar38 [16];
  uint uVar41;
  uint uVar42;
  uint uVar45;
  ulong uVar43;
  uint uVar46;
  undefined1 auVar44 [16];
  uint uVar48;
  ulong uVar47;
  int iVar49;
  uint uVar52;
  int iVar53;
  uint uVar54;
  undefined1 auVar51 [16];
  int iVar55;
  uint uVar56;
  int iVar57;
  int iVar60;
  int iVar61;
  undefined1 in_XMM8 [16];
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar59 [16];
  uint uVar63;
  uint uVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  undefined1 in_XMM9 [16];
  undefined1 auVar64 [16];
  uint uVar69;
  int iVar70;
  __m128i alVar71;
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar73 [16];
  int32_t iVar50;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_32_cold_1();
        }
        else {
          uVar10 = uVar25 - 1;
          uVar17 = (ulong)uVar25 + 3 >> 2;
          uVar36 = (ulong)uVar10 % uVar17;
          iVar14 = (int)(uVar10 / uVar17);
          iVar24 = -open;
          iVar13 = ppVar6->min;
          uVar22 = 0x80000000 - iVar13;
          if (iVar13 != iVar24 && SBORROW4(iVar13,iVar24) == iVar13 + open < 0) {
            uVar22 = open | 0x80000000;
          }
          uVar23 = 0x7ffffffe - ppVar6->max;
          ppVar11 = parasail_result_new_rowcol1((uint)((ulong)uVar25 + 3) & 0x7ffffffc,s2Len);
          if (ppVar11 != (parasail_result_t *)0x0) {
            ppVar11->flag = ppVar11->flag | 0x4440801;
            ptr = parasail_memalign___m128i(0x10,uVar17);
            palVar12 = parasail_memalign___m128i(0x10,uVar17);
            ptr_00 = parasail_memalign___m128i(0x10,uVar17);
            ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar12 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar13 = s2Len + -1;
              uVar22 = uVar22 + 1;
              auVar38._4_4_ = iVar24;
              auVar38._0_4_ = iVar24;
              auVar38._8_4_ = iVar24;
              auVar38._12_4_ = iVar24;
              auVar44._0_8_ = CONCAT44(0,open);
              auVar44._8_4_ = open;
              auVar44._12_4_ = 0;
              auVar51._8_4_ = (int)uVar17;
              auVar51._0_8_ = uVar17;
              auVar51._12_4_ = 0;
              auVar58 = pmovsxbq(in_XMM8,0x302);
              auVar58 = pmuldq(auVar58,auVar51);
              auVar51 = pmuldq(auVar51,_DAT_00903a90);
              uVar19 = 0;
              auVar64 = pmovsxdq(in_XMM9,0x8000000080000000);
              palVar20 = ptr;
              palVar21 = ptr_00;
              do {
                auVar73._8_4_ = (int)uVar19;
                auVar73._0_8_ = uVar19;
                auVar73._12_4_ = (int)(uVar19 >> 0x20);
                auVar26._0_4_ = (undefined4)(uVar19 + auVar51._0_8_);
                auVar26._4_4_ = (int)(auVar73._8_8_ + auVar51._8_8_);
                auVar26._8_4_ = (int)(auVar58._0_8_ + uVar19);
                auVar26._12_4_ = (int)(auVar58._8_8_ + auVar73._8_8_);
                auVar27._4_4_ = gap;
                auVar27._0_4_ = gap;
                auVar27._8_4_ = gap;
                auVar27._12_4_ = gap;
                auVar27 = pmulld(auVar26,auVar27);
                alVar71[0]._0_4_ = iVar24 - auVar27._0_4_;
                alVar71[0]._4_4_ = iVar24 - auVar27._4_4_;
                alVar71[1]._0_4_ = iVar24 - auVar27._8_4_;
                alVar71[1]._4_4_ = iVar24 - auVar27._12_4_;
                auVar27 = pmovsxdq(in_XMM11,(undefined1  [16])alVar71);
                auVar28._4_4_ = alVar71[1]._4_4_;
                auVar28._0_4_ = (int)alVar71[1];
                auVar28._8_4_ = (int)alVar71[1];
                auVar28._12_4_ = alVar71[1]._4_4_;
                auVar73 = pmovsxdq(in_XMM12,auVar28);
                in_XMM12._0_8_ = auVar73._0_8_ - auVar44._0_8_;
                in_XMM12._8_8_ = auVar73._8_8_ - (ulong)(uint)open;
                auVar72._0_8_ = auVar27._0_8_ - auVar44._0_8_;
                auVar72._8_8_ = auVar27._8_8_ - (ulong)(uint)open;
                auVar29._0_8_ = -(ulong)(auVar64._0_8_ < auVar72._0_8_);
                auVar29._8_8_ = -(ulong)(auVar64._8_8_ < auVar72._8_8_);
                auVar27 = blendvpd(auVar64,auVar72,auVar29);
                auVar30._0_8_ = -(ulong)(auVar64._0_8_ < in_XMM12._0_8_);
                auVar30._8_8_ = -(ulong)(auVar64._8_8_ < in_XMM12._8_8_);
                in_XMM11 = blendvpd(auVar64,in_XMM12,auVar30);
                *palVar20 = alVar71;
                *(int *)*palVar21 = auVar27._0_4_;
                *(int *)((long)*palVar21 + 4) = auVar27._8_4_;
                *(int *)(*palVar21 + 1) = in_XMM11._0_4_;
                *(int *)((long)*palVar21 + 0xc) = in_XMM11._8_4_;
                uVar19 = uVar19 + 1;
                palVar21 = palVar21 + 1;
                palVar20 = palVar20 + 1;
              } while (uVar17 != uVar19);
              *ptr_01 = 0;
              auVar51 = _DAT_00906ca0;
              lVar18 = (ulong)(uint)s2Len - 1;
              auVar58._8_4_ = (int)lVar18;
              auVar58._0_8_ = lVar18;
              auVar58._12_4_ = (int)((ulong)lVar18 >> 0x20);
              uVar19 = 0;
              auVar38 = pmovsxbq(auVar38,0x302);
              auVar44 = pmovsxbq(auVar44,0x100);
              auVar58 = auVar58 ^ _DAT_00906ca0;
              do {
                uVar47 = auVar51._0_8_;
                lVar18 = auVar58._0_8_;
                if ((bool)(~(lVar18 < (long)(uVar19 ^ uVar47)) & 1)) {
                  ptr_01[uVar19 + 1] = iVar24;
                }
                auVar64._8_4_ = (int)uVar19;
                auVar64._0_8_ = uVar19;
                auVar64._12_4_ = (int)(uVar19 >> 0x20);
                if ((long)((auVar64._8_8_ | auVar44._8_8_) ^ auVar51._8_8_) <= auVar58._8_8_) {
                  ptr_01[uVar19 + 2] = iVar24 - gap;
                }
                if ((long)((uVar19 | auVar38._0_8_) ^ uVar47) <= lVar18) {
                  ptr_01[uVar19 + 3] = gap * -2 + iVar24;
                  ptr_01[uVar19 + 4] = gap * -3 + iVar24;
                }
                uVar19 = uVar19 + 4;
                iVar24 = iVar24 + gap * -4;
              } while ((s2Len + 3U & 0xfffffffc) != uVar19);
              uVar19 = 0;
              uVar25 = uVar22;
              uVar32 = uVar22;
              uVar33 = uVar22;
              uVar34 = uVar22;
              uVar37 = uVar23;
              uVar39 = uVar23;
              uVar40 = uVar23;
              uVar41 = uVar23;
              do {
                palVar20 = ptr;
                ptr = palVar12;
                iVar4 = ppVar6->mapper[(byte)s2[uVar19]];
                palVar12 = palVar20 + ((int)uVar17 - 1);
                iVar24 = (int)(*palVar12)[0];
                iVar53 = *(int *)((long)*palVar12 + 4);
                iVar55 = (int)(*palVar12)[1];
                iVar50 = ptr_01[uVar19];
                lVar18 = 0;
                uVar42 = uVar22;
                uVar45 = uVar22;
                uVar46 = uVar22;
                uVar48 = uVar22;
                do {
                  piVar1 = (int *)((long)pvVar5 + lVar18 + uVar17 * (long)iVar4 * 0x10);
                  iVar49 = iVar50 + *piVar1;
                  iVar24 = iVar24 + piVar1[1];
                  iVar53 = iVar53 + piVar1[2];
                  iVar55 = iVar55 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar18);
                  iVar57 = *piVar1;
                  iVar60 = piVar1[1];
                  iVar61 = piVar1[2];
                  iVar62 = piVar1[3];
                  uVar63 = (iVar57 < (int)uVar42) * uVar42 | (uint)(iVar57 >= (int)uVar42) * iVar57;
                  uVar65 = (iVar60 < (int)uVar45) * uVar45 | (uint)(iVar60 >= (int)uVar45) * iVar60;
                  uVar67 = (iVar61 < (int)uVar46) * uVar46 | (uint)(iVar61 >= (int)uVar46) * iVar61;
                  uVar69 = (iVar62 < (int)uVar48) * uVar48 | (uint)(iVar62 >= (int)uVar48) * iVar62;
                  uVar63 = (uint)((int)uVar63 < iVar49) * iVar49 | ((int)uVar63 >= iVar49) * uVar63;
                  uVar65 = (uint)((int)uVar65 < iVar24) * iVar24 | ((int)uVar65 >= iVar24) * uVar65;
                  uVar67 = (uint)((int)uVar67 < iVar53) * iVar53 | ((int)uVar67 >= iVar53) * uVar67;
                  uVar69 = (uint)((int)uVar69 < iVar55) * iVar55 | ((int)uVar69 >= iVar55) * uVar69;
                  puVar2 = (uint *)((long)*ptr + lVar18);
                  *puVar2 = uVar63;
                  puVar2[1] = uVar65;
                  puVar2[2] = uVar67;
                  puVar2[3] = uVar69;
                  uVar25 = ((int)uVar25 < (int)uVar63) * uVar63 |
                           ((int)uVar25 >= (int)uVar63) * uVar25;
                  uVar32 = ((int)uVar32 < (int)uVar65) * uVar65 |
                           ((int)uVar32 >= (int)uVar65) * uVar32;
                  uVar33 = ((int)uVar33 < (int)uVar67) * uVar67 |
                           ((int)uVar33 >= (int)uVar67) * uVar33;
                  uVar34 = ((int)uVar34 < (int)uVar69) * uVar69 |
                           ((int)uVar34 >= (int)uVar69) * uVar34;
                  uVar37 = (uint)(iVar57 < (int)uVar37) * iVar57 | (iVar57 >= (int)uVar37) * uVar37;
                  uVar39 = (uint)(iVar60 < (int)uVar39) * iVar60 | (iVar60 >= (int)uVar39) * uVar39;
                  uVar40 = (uint)(iVar61 < (int)uVar40) * iVar61 | (iVar61 >= (int)uVar40) * uVar40;
                  uVar41 = (uint)(iVar62 < (int)uVar41) * iVar62 | (iVar62 >= (int)uVar41) * uVar41;
                  uVar37 = ((int)uVar42 < (int)uVar37) * uVar42 |
                           ((int)uVar42 >= (int)uVar37) * uVar37;
                  uVar39 = ((int)uVar45 < (int)uVar39) * uVar45 |
                           ((int)uVar45 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar46 < (int)uVar40) * uVar46 |
                           ((int)uVar46 >= (int)uVar40) * uVar40;
                  uVar41 = ((int)uVar48 < (int)uVar41) * uVar48 |
                           ((int)uVar48 >= (int)uVar41) * uVar41;
                  uVar37 = ((int)uVar63 < (int)uVar37) * uVar63 |
                           ((int)uVar63 >= (int)uVar37) * uVar37;
                  uVar39 = ((int)uVar65 < (int)uVar39) * uVar65 |
                           ((int)uVar65 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar67 < (int)uVar40) * uVar67 |
                           ((int)uVar67 >= (int)uVar40) * uVar40;
                  uVar41 = ((int)uVar69 < (int)uVar41) * uVar69 |
                           ((int)uVar69 >= (int)uVar41) * uVar41;
                  iVar49 = uVar63 - open;
                  iVar66 = uVar65 - open;
                  iVar68 = uVar67 - open;
                  iVar70 = uVar69 - open;
                  iVar57 = iVar57 - gap;
                  iVar60 = iVar60 - gap;
                  iVar61 = iVar61 - gap;
                  iVar62 = iVar62 - gap;
                  puVar2 = (uint *)((long)*ptr_00 + lVar18);
                  *puVar2 = (uint)(iVar57 < iVar49) * iVar49 | (uint)(iVar57 >= iVar49) * iVar57;
                  puVar2[1] = (uint)(iVar60 < iVar66) * iVar66 | (uint)(iVar60 >= iVar66) * iVar60;
                  puVar2[2] = (uint)(iVar61 < iVar68) * iVar68 | (uint)(iVar61 >= iVar68) * iVar61;
                  puVar2[3] = (uint)(iVar62 < iVar70) * iVar70 | (uint)(iVar62 >= iVar70) * iVar62;
                  iVar24 = uVar42 - gap;
                  iVar53 = uVar45 - gap;
                  iVar55 = uVar46 - gap;
                  iVar57 = uVar48 - gap;
                  uVar42 = (uint)(iVar24 < iVar49) * iVar49 | (uint)(iVar24 >= iVar49) * iVar24;
                  uVar45 = (uint)(iVar53 < iVar66) * iVar66 | (uint)(iVar53 >= iVar66) * iVar53;
                  uVar46 = (uint)(iVar55 < iVar68) * iVar68 | (uint)(iVar55 >= iVar68) * iVar55;
                  uVar48 = (uint)(iVar57 < iVar70) * iVar70 | (uint)(iVar57 >= iVar70) * iVar57;
                  piVar1 = (int *)((long)*palVar20 + lVar18);
                  iVar50 = *piVar1;
                  iVar24 = piVar1[1];
                  iVar53 = piVar1[2];
                  iVar55 = piVar1[3];
                  lVar18 = lVar18 + 0x10;
                } while (uVar17 << 4 != lVar18);
                iVar24 = 0;
                pcVar15 = s2;
                do {
                  lVar18 = 0;
                  uVar48 = ptr_01[uVar19 + 1] - open;
                  uVar63 = uVar42;
                  uVar65 = uVar45;
                  uVar67 = uVar46;
                  do {
                    piVar1 = (int *)((long)*ptr + lVar18);
                    iVar53 = *piVar1;
                    iVar55 = piVar1[1];
                    iVar4 = piVar1[2];
                    iVar57 = piVar1[3];
                    uVar69 = (iVar53 < (int)uVar48) * uVar48 |
                             (uint)(iVar53 >= (int)uVar48) * iVar53;
                    uVar52 = (iVar55 < (int)uVar63) * uVar63 |
                             (uint)(iVar55 >= (int)uVar63) * iVar55;
                    uVar54 = (iVar4 < (int)uVar65) * uVar65 | (uint)(iVar4 >= (int)uVar65) * iVar4;
                    uVar56 = (iVar57 < (int)uVar67) * uVar67 |
                             (uint)(iVar57 >= (int)uVar67) * iVar57;
                    puVar2 = (uint *)((long)*ptr + lVar18);
                    *puVar2 = uVar69;
                    puVar2[1] = uVar52;
                    puVar2[2] = uVar54;
                    puVar2[3] = uVar56;
                    uVar37 = ((int)uVar69 < (int)uVar37) * uVar69 |
                             ((int)uVar69 >= (int)uVar37) * uVar37;
                    uVar39 = ((int)uVar52 < (int)uVar39) * uVar52 |
                             ((int)uVar52 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar54 < (int)uVar40) * uVar54 |
                             ((int)uVar54 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar56 < (int)uVar41) * uVar56 |
                             ((int)uVar56 >= (int)uVar41) * uVar41;
                    uVar25 = ((int)uVar25 < (int)uVar69) * uVar69 |
                             ((int)uVar25 >= (int)uVar69) * uVar25;
                    uVar32 = ((int)uVar32 < (int)uVar52) * uVar52 |
                             ((int)uVar32 >= (int)uVar52) * uVar32;
                    uVar33 = ((int)uVar33 < (int)uVar54) * uVar54 |
                             ((int)uVar33 >= (int)uVar54) * uVar33;
                    uVar34 = ((int)uVar34 < (int)uVar56) * uVar56 |
                             ((int)uVar34 >= (int)uVar56) * uVar34;
                    uVar42 = uVar48 - gap;
                    uVar45 = uVar63 - gap;
                    uVar46 = uVar65 - gap;
                    uVar67 = uVar67 - gap;
                    auVar59._0_4_ = -(uint)((int)(uVar69 - open) < (int)uVar42);
                    auVar59._4_4_ = -(uint)((int)(uVar52 - open) < (int)uVar45);
                    auVar59._8_4_ = -(uint)((int)(uVar54 - open) < (int)uVar46);
                    auVar59._12_4_ = -(uint)((int)(uVar56 - open) < (int)uVar67);
                    uVar48 = movmskps((int)pcVar15,auVar59);
                    pcVar15 = (char *)(ulong)uVar48;
                    if (uVar48 == 0) goto LAB_007102b6;
                    lVar18 = lVar18 + 0x10;
                    uVar48 = uVar42;
                    uVar63 = uVar45;
                    uVar65 = uVar46;
                  } while (uVar17 << 4 != lVar18);
                  iVar24 = iVar24 + 1;
                } while (iVar24 != 4);
LAB_007102b6:
                uVar47 = ptr[uVar36][1];
                if (iVar14 < 3) {
                  iVar24 = 0;
                  uVar43 = ptr[uVar36][0];
                  do {
                    uVar47 = uVar47 << 0x20 | uVar43 >> 0x20;
                    iVar24 = iVar24 + 1;
                    uVar43 = uVar43 << 0x20;
                  } while (iVar24 < 3 - iVar14);
                }
                ((ppVar11->field_4).rowcols)->score_row[uVar19] = (int)(uVar47 >> 0x20);
                uVar19 = uVar19 + 1;
                palVar12 = palVar20;
                if (uVar19 == (uint)s2Len) {
                  lVar18 = 0;
                  do {
                    puVar3 = (undefined4 *)((long)*ptr + lVar18 * 4);
                    uVar7 = puVar3[1];
                    uVar8 = puVar3[2];
                    uVar9 = puVar3[3];
                    piVar1 = ((ppVar11->field_4).rowcols)->score_col;
                    *(undefined4 *)((long)piVar1 + lVar18) = *puVar3;
                    lVar16 = (long)piVar1 + lVar18;
                    *(undefined4 *)(uVar17 * 4 + lVar16) = uVar7;
                    *(undefined4 *)(uVar17 * 8 + lVar16) = uVar8;
                    *(undefined4 *)(uVar17 * 0xc + lVar16) = uVar9;
                    lVar18 = lVar18 + 4;
                  } while (uVar17 * 4 - lVar18 != 0);
                  uVar17 = ptr[uVar36][1];
                  if (iVar14 < 3) {
                    iVar24 = 0;
                    uVar36 = ptr[uVar36][0];
                    do {
                      uVar17 = uVar17 << 0x20 | uVar36 >> 0x20;
                      iVar24 = iVar24 + 1;
                      uVar36 = uVar36 << 0x20;
                    } while (iVar24 < 3 - iVar14);
                  }
                  auVar35._0_4_ = -(uint)((int)uVar37 < (int)uVar22);
                  auVar35._4_4_ = -(uint)((int)uVar39 < (int)uVar22);
                  auVar35._8_4_ = -(uint)((int)uVar40 < (int)uVar22);
                  auVar35._12_4_ = -(uint)((int)uVar41 < (int)uVar22);
                  auVar31._0_4_ = -(uint)((int)uVar23 < (int)uVar25);
                  auVar31._4_4_ = -(uint)((int)uVar23 < (int)uVar32);
                  auVar31._8_4_ = -(uint)((int)uVar23 < (int)uVar33);
                  auVar31._12_4_ = -(uint)((int)uVar23 < (int)uVar34);
                  iVar14 = movmskps((int)lVar16,auVar31 | auVar35);
                  if (iVar14 == 0) {
                    iVar14 = (int)(uVar17 >> 0x20);
                  }
                  else {
                    *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                    iVar14 = 0;
                    iVar13 = 0;
                    uVar10 = 0;
                  }
                  ppVar11->score = iVar14;
                  ppVar11->end_query = uVar10;
                  ppVar11->end_ref = iVar13;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar20);
                  parasail_free(ptr);
                  return ppVar11;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}